

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O1

void __thiscall
NetGroupManager::ASMapHealthCheck
          (NetGroupManager *this,vector<CNetAddr,_std::allocator<CNetAddr>_> *clearnet_addrs)

{
  pointer pCVar1;
  uint32_t uVar2;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *__range1;
  CNetAddr *addr;
  pointer address;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  unsigned_long local_80;
  uint32_t asn;
  undefined4 uStack_74;
  int unmapped_count;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  unmapped_count = 0;
  address = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (address != pCVar1) {
    do {
      uVar2 = GetMappedAS(this,address);
      _asn = CONCAT44(uStack_74,uVar2);
      if (uVar2 == 0) {
        unmapped_count = unmapped_count + 1;
      }
      else {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_68,&asn);
      }
      address = address + 1;
    } while (address != pCVar1);
  }
  _asn = (long)(clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
               super__Vector_impl_data._M_start >> 5;
  local_80 = local_68._M_impl.super__Rb_tree_header._M_node_count;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netgroup.cpp"
  ;
  source_file._M_len = 0x5c;
  logging_function._M_str = "ASMapHealthCheck";
  logging_function._M_len = 0x10;
  LogPrintFormatInternal<unsigned_long,unsigned_long,int>
            (logging_function,source_file,0x7f,ALL,Info,(ConstevalFormatString<3U>)0xfa00c6,
             (unsigned_long *)&asn,&local_80,&unmapped_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void NetGroupManager::ASMapHealthCheck(const std::vector<CNetAddr>& clearnet_addrs) const {
    std::set<uint32_t> clearnet_asns{};
    int unmapped_count{0};

    for (const auto& addr : clearnet_addrs) {
        uint32_t asn = GetMappedAS(addr);
        if (asn == 0) {
            ++unmapped_count;
            continue;
        }
        clearnet_asns.insert(asn);
    }

    LogPrintf("ASMap Health Check: %i clearnet peers are mapped to %i ASNs with %i peers being unmapped\n", clearnet_addrs.size(), clearnet_asns.size(), unmapped_count);
}